

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void __thiscall WorkQueue<HTTPClosure>::Run(WorkQueue<HTTPClosure> *this)

{
  _Head_base<0UL,_HTTPClosure_*,_false> _Var1;
  _Elt_pointer puVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_40._M_owns = false;
    local_40._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_40);
    if (this->running == true) {
      do {
        puVar2 = (this->queue).
                 super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if ((this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur != puVar2) goto LAB_0046849e;
        std::condition_variable::wait((unique_lock *)&this->cond);
      } while (this->running != false);
    }
    puVar2 = (this->queue).
             super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->queue).
        super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
LAB_0046849e:
    _Var1._M_head_impl =
         (puVar2->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t.
         super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
         super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl;
    (puVar2->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t.
    super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
    super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl = (HTTPClosure *)0x0;
    std::
    deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
    ::pop_front(&this->queue);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    (**(_Var1._M_head_impl)->_vptr_HTTPClosure)(_Var1._M_head_impl);
    (*(_Var1._M_head_impl)->_vptr_HTTPClosure[2])(_Var1._M_head_impl);
  } while( true );
}

Assistant:

void Run() EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        while (true) {
            std::unique_ptr<WorkItem> i;
            {
                WAIT_LOCK(cs, lock);
                while (running && queue.empty())
                    cond.wait(lock);
                if (!running && queue.empty())
                    break;
                i = std::move(queue.front());
                queue.pop_front();
            }
            (*i)();
        }
    }